

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int64_t roundAndPackInt64(flag zSign,uint64_t absZ0,uint64_t absZ1,float_status *status)

{
  uint64_t uVar1;
  int64_t iVar2;
  byte bVar3;
  bool bVar4;
  
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    bVar3 = (byte)(absZ1 >> 0x3f);
    goto LAB_00cf761e;
  case '\x01':
    bVar4 = zSign != '\0';
    break;
  case '\x02':
    bVar4 = zSign == '\0';
    break;
  case '\x03':
    goto switchD_00cf75f2_caseD_3;
  case '\x05':
    bVar4 = (absZ0 & 1) == 0;
    break;
  default:
    abort();
  }
  bVar3 = absZ1 != 0 & bVar4;
LAB_00cf761e:
  if (bVar3 != 0) {
    if (absZ0 + 1 == 0) goto LAB_00cf7675;
    absZ0 = absZ0 + 1 &
            ~(ulong)((absZ1 & 0x7fffffffffffffff) == 0 && status->float_rounding_mode == '\0');
  }
switchD_00cf75f2_caseD_3:
  uVar1 = -absZ0;
  if (zSign == '\0') {
    uVar1 = absZ0;
  }
  if ((uVar1 == 0) || ((uint)(uVar1 >> 0x3f) == (uint)zSign)) {
    if (absZ1 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    return uVar1;
  }
LAB_00cf7675:
  status->float_exception_flags = status->float_exception_flags | 1;
  iVar2 = -0x8000000000000000;
  if (zSign == '\0') {
    iVar2 = 0x7fffffffffffffff;
  }
  return iVar2;
}

Assistant:

static int64_t roundAndPackInt64(flag zSign, uint64_t absZ0, uint64_t absZ1,
                               float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment;
    int64_t z;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t) absZ1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && absZ1;
        break;
    case float_round_down:
        increment = zSign && absZ1;
        break;
    case float_round_to_odd:
        increment = !(absZ0 & 1) && absZ1;
        break;
    default:
        abort();
    }
    if ( increment ) {
        ++absZ0;
        if ( absZ0 == 0 ) goto overflow;
        absZ0 &= ~ ( ( (uint64_t) ( absZ1<<1 ) == 0 ) & roundNearestEven );
    }
    z = absZ0;
    if ( zSign ) z = - z;
    if ( z && ( ( z < 0 ) ^ zSign ) ) {
 overflow:
        float_raise(float_flag_invalid, status);
        return zSign ? INT64_MIN : INT64_MAX;
    }
    if (absZ1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}